

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::decodeUnicodeEscapeSequence
          (OurReader *this,Token *token,Location *current,Location end,uint *unicode)

{
  char *pcVar1;
  bool bVar2;
  long in_RCX;
  long *in_RDX;
  int *in_R8;
  Char c;
  int index;
  allocator local_91;
  string local_90 [39];
  char local_69;
  undefined4 in_stack_ffffffffffffff98;
  int iVar3;
  undefined4 in_stack_ffffffffffffff9c;
  Token *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  OurReader *in_stack_ffffffffffffffb0;
  bool local_1;
  
  if (in_RCX - *in_RDX < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffb0,
               "Bad unicode escape sequence in string: four digits expected.",
               (allocator *)&stack0xffffffffffffffaf);
    local_1 = addError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0
                       ,(Location)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  }
  else {
    *in_R8 = 0;
    for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
      pcVar1 = (char *)*in_RDX;
      *in_RDX = (long)(pcVar1 + 1);
      local_69 = *pcVar1;
      *in_R8 = *in_R8 << 4;
      if ((local_69 < '0') || ('9' < local_69)) {
        if ((local_69 < 'a') || ('f' < local_69)) {
          if ((local_69 < 'A') || ('F' < local_69)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_90,"Bad unicode escape sequence in string: hexadecimal digit expected."
                       ,&local_91);
            bVar2 = addError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                             in_stack_ffffffffffffffa0,
                             (Location)CONCAT44(in_stack_ffffffffffffff9c,iVar3));
            std::__cxx11::string::~string(local_90);
            std::allocator<char>::~allocator((allocator<char> *)&local_91);
            return bVar2;
          }
          *in_R8 = local_69 + -0x37 + *in_R8;
        }
        else {
          *in_R8 = local_69 + -0x57 + *in_R8;
        }
      }
      else {
        *in_R8 = local_69 + -0x30 + *in_R8;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool OurReader::decodeUnicodeEscapeSequence(Token& token,
                                         Location& current,
                                         Location end,
                                         unsigned int& unicode) {
  if (end - current < 4)
    return addError(
        "Bad unicode escape sequence in string: four digits expected.",
        token,
        current);
  unicode = 0;
  for (int index = 0; index < 4; ++index) {
    Char c = *current++;
    unicode *= 16;
    if (c >= '0' && c <= '9')
      unicode += c - '0';
    else if (c >= 'a' && c <= 'f')
      unicode += c - 'a' + 10;
    else if (c >= 'A' && c <= 'F')
      unicode += c - 'A' + 10;
    else
      return addError(
          "Bad unicode escape sequence in string: hexadecimal digit expected.",
          token,
          current);
  }
  return true;
}